

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenPackUnPack_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,IDLOptions *opts,
          bool struct_has_create,
          set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
          *field_has_create)

{
  Value *pVVar1;
  BaseType BVar2;
  FieldDef *pFVar3;
  StructDef *pSVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  _Base_ptr p_Var10;
  pointer ppFVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_type *psVar14;
  long *plVar15;
  _Base_ptr p_Var16;
  _Alloc_hider *p_Var17;
  undefined8 *puVar18;
  char *pcVar19;
  string *psVar20;
  pointer ppFVar21;
  char *pcVar22;
  undefined8 uVar23;
  EnumDef *pEVar24;
  undefined8 uVar25;
  _Alloc_hider _Var26;
  EnumDef *pEVar27;
  undefined7 in_register_00000081;
  string type_name;
  string length_str;
  string create_string_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  string camel_name_short;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string camel_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> start;
  string struct_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  string local_248;
  string *local_228;
  undefined1 local_220 [24];
  uint16_t uStack_208;
  undefined6 uStack_206;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  uint local_1a0;
  string local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  CSharpGenerator *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  IDLOptions *local_f0;
  undefined4 local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  _Base_ptr local_c0;
  set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
  *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_228 = code_ptr;
  local_138 = this;
  local_f0 = opts;
  local_b8 = field_has_create;
  GenTypeName_ObjectAPI(&local_50,this,(string *)struct_def,opts);
  std::operator+(&local_200,"  public ",&local_50);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar12) {
    local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_1b0._8_8_ = plVar8[3];
    local_1c0._M_allocated_capacity = (size_type)&local_1b0;
  }
  else {
    local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_1c0._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_1c0._8_8_ = plVar8[1];
  *plVar8 = (long)paVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
  local_e4 = (undefined4)CONCAT71(in_register_00000081,struct_has_create);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_allocated_capacity != &local_1b0) {
    operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
  }
  paVar12 = &local_200.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar12) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_200,"    var _o = new ",&local_50);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar13) {
    local_1b0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1b0._8_8_ = plVar8[3];
    local_1c0._M_allocated_capacity = (size_type)&local_1b0;
  }
  else {
    local_1b0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1c0._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_1c0._8_8_ = plVar8[1];
  *plVar8 = (long)paVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_allocated_capacity != &local_1b0) {
    operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar12) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  psVar20 = local_228;
  std::__cxx11::string::append((char *)local_228);
  std::__cxx11::string::append((char *)psVar20);
  std::__cxx11::string::append((char *)psVar20);
  std::operator+(&local_200,"  public void UnPackTo(",&local_50);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar13) {
    local_1b0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1b0._8_8_ = plVar8[3];
    local_1c0._M_allocated_capacity = (size_type)&local_1b0;
  }
  else {
    local_1b0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1c0._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_1c0._8_8_ = plVar8[1];
  *plVar8 = (long)paVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_allocated_capacity != &local_1b0) {
    operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar12) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  ppFVar21 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar11 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar21 != ppFVar11) {
    do {
      pFVar3 = *ppFVar21;
      if (pFVar3->deprecated == false) {
        Name_abi_cxx11_((string *)&local_1c0,local_138,pFVar3);
        if ((local_1c0._8_8_ == (struct_def->super_Definition).name._M_string_length) &&
           ((local_1c0._8_8_ == 0 ||
            (iVar7 = bcmp((void *)local_1c0._M_allocated_capacity,
                          (struct_def->super_Definition).name._M_dataplus._M_p,local_1c0._8_8_),
            iVar7 == 0)))) {
          std::__cxx11::string::append(local_1c0._M_local_buf);
        }
        Name_abi_cxx11_(&local_200,local_138,pFVar3);
        std::operator+(&local_288,"    _o.",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_288);
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 == paVar12) {
          local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_168._8_8_ = plVar8[3];
          local_178._M_allocated_capacity = (size_type)&local_168;
        }
        else {
          local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_178._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_178._8_8_ = plVar8[1];
        *plVar8 = (long)paVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          (ulong)(local_288.field_2._M_allocated_capacity + 1));
        }
        BVar2 = (pFVar3->value).type.base_type;
        if (BVar2 - BASE_TYPE_VECTOR < 4) {
          pVVar1 = &pFVar3->value;
          switch(BVar2) {
          case BASE_TYPE_VECTOR:
            BVar2 = (pFVar3->value).type.element;
            if (BVar2 != BASE_TYPE_UTYPE) {
              if (BVar2 == BASE_TYPE_UNION) {
                local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1e0,local_178._M_allocated_capacity,
                           local_178._8_8_ + local_178._M_allocated_capacity);
                std::__cxx11::string::append((char *)&local_1e0);
                GenTypeGet_ObjectAPI_abi_cxx11_(&local_248,local_138,pVVar1->type,local_f0);
                uVar23 = (EnumDef *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                  uVar23 = local_1e0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar23 <
                    (EnumDef *)(local_248._M_string_length + local_1e0._M_string_length)) {
                  uVar23 = (EnumDef *)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    uVar23 = local_248.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar23 <
                      (EnumDef *)(local_248._M_string_length + local_1e0._M_string_length))
                  goto LAB_001b345f;
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_248,0,(char *)0x0,
                                      (ulong)local_1e0._M_dataplus._M_p);
                }
                else {
LAB_001b345f:
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_1e0,(ulong)local_248._M_dataplus._M_p);
                }
                local_268._M_allocated_capacity = (size_type)&local_258;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_258._8_8_ = puVar9[3];
                }
                else {
                  local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_268._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar9;
                }
                local_268._8_8_ = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                paVar12->_M_local_buf[0] = '\0';
                plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
                local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                psVar14 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_288.field_2._M_allocated_capacity = *psVar14;
                  local_288.field_2._8_8_ = plVar8[3];
                }
                else {
                  local_288.field_2._M_allocated_capacity = *psVar14;
                  local_288._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_288._M_string_length = plVar8[1];
                *plVar8 = (long)psVar14;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_allocated_capacity != &local_258) {
                  operator_delete((void *)local_268._M_allocated_capacity,
                                  (ulong)(local_258._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  (ulong)(local_248.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                  operator_delete(local_1e0._M_dataplus._M_p,
                                  (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_268,"    for (var _j = 0; _j < this.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_1c0);
                puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
                local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_288.field_2._8_8_ = puVar9[3];
                }
                else {
                  local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_288._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_288._M_string_length = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  (ulong)(local_288.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_allocated_capacity != &local_258) {
                  operator_delete((void *)local_268._M_allocated_capacity,
                                  (ulong)(local_258._M_allocated_capacity + 1));
                }
                GenUnionUnPack_ObjectAPI
                          (local_138,(pFVar3->value).type.enum_def,local_228,(string *)&local_1c0,
                           &local_200,true);
                std::__cxx11::string::append((char *)local_228);
              }
              else {
                pSVar4 = (pFVar3->value).type.struct_def;
                local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1e0,local_178._M_allocated_capacity,
                           local_178._8_8_ + local_178._M_allocated_capacity);
                std::__cxx11::string::append((char *)&local_1e0);
                GenTypeGet_ObjectAPI_abi_cxx11_(&local_248,local_138,pVVar1->type,local_f0);
                uVar23 = (EnumDef *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                  uVar23 = local_1e0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar23 <
                    (EnumDef *)(local_248._M_string_length + local_1e0._M_string_length)) {
                  uVar23 = (EnumDef *)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    uVar23 = local_248.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar23 <
                      (EnumDef *)(local_248._M_string_length + local_1e0._M_string_length))
                  goto LAB_001b3967;
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_248,0,(char *)0x0,
                                      (ulong)local_1e0._M_dataplus._M_p);
                }
                else {
LAB_001b3967:
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_1e0,(ulong)local_248._M_dataplus._M_p);
                }
                local_268._M_allocated_capacity = (size_type)&local_258;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_258._8_8_ = puVar9[3];
                }
                else {
                  local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_268._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar9;
                }
                local_268._8_8_ = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                paVar12->_M_local_buf[0] = '\0';
                plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
                local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                psVar14 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_288.field_2._M_allocated_capacity = *psVar14;
                  local_288.field_2._8_8_ = plVar8[3];
                }
                else {
                  local_288.field_2._M_allocated_capacity = *psVar14;
                  local_288._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_288._M_string_length = plVar8[1];
                *plVar8 = (long)psVar14;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_allocated_capacity != &local_258) {
                  operator_delete((void *)local_268._M_allocated_capacity,
                                  (ulong)(local_258._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  (ulong)(local_248.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                  operator_delete(local_1e0._M_dataplus._M_p,
                                  (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_268,"    for (var _j = 0; _j < this.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_1c0);
                plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
                local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                psVar14 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_288.field_2._M_allocated_capacity = *psVar14;
                  local_288.field_2._8_8_ = plVar8[3];
                }
                else {
                  local_288.field_2._M_allocated_capacity = *psVar14;
                  local_288._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_288._M_string_length = plVar8[1];
                *plVar8 = (long)psVar14;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_allocated_capacity != &local_258) {
                  operator_delete((void *)local_268._M_allocated_capacity,
                                  (ulong)(local_258._M_allocated_capacity + 1));
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_268,"_o.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_1c0);
                plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
                local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                psVar14 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_288.field_2._M_allocated_capacity = *psVar14;
                  local_288.field_2._8_8_ = plVar8[3];
                }
                else {
                  local_288.field_2._M_allocated_capacity = *psVar14;
                  local_288._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_288._M_string_length = plVar8[1];
                *plVar8 = (long)psVar14;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_allocated_capacity != &local_258) {
                  operator_delete((void *)local_268._M_allocated_capacity,
                                  (ulong)(local_258._M_allocated_capacity + 1));
                }
                if (pSVar4 == (StructDef *)0x0) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_268,"this.",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_1c0);
                  puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar9 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9 == paVar12) {
                    local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_288.field_2._8_8_ = puVar9[3];
                    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                  }
                  else {
                    local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_288._M_dataplus._M_p = (pointer)*puVar9;
                  }
                  local_288._M_string_length = puVar9[1];
                  *puVar9 = paVar12;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)local_228,(ulong)local_288._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_288._M_dataplus._M_p != &local_288.field_2) {
                    operator_delete(local_288._M_dataplus._M_p,
                                    (ulong)(local_288.field_2._M_allocated_capacity + 1));
                  }
                  uVar23 = local_258._M_allocated_capacity;
                  uVar25 = local_268._M_allocated_capacity;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_268._M_allocated_capacity != &local_258) goto LAB_001b4a48;
                }
                else {
                  std::operator+(&local_248,"this.",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_1c0);
                  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
                  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar9 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9 == paVar12) {
                    local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_1e0.field_2._8_8_ = puVar9[3];
                  }
                  else {
                    local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_1e0._M_dataplus._M_p = (pointer)*puVar9;
                  }
                  local_1e0._M_string_length = puVar9[1];
                  *puVar9 = paVar12;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  puVar9 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_1e0,local_1c0._M_allocated_capacity);
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar9 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9 == paVar12) {
                    local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_258._8_8_ = puVar9[3];
                    local_268._M_allocated_capacity = (size_type)&local_258;
                  }
                  else {
                    local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_268._M_allocated_capacity =
                         (size_type)
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*puVar9;
                  }
                  local_268._8_8_ = puVar9[1];
                  *puVar9 = paVar12;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
                  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar9 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9 == paVar12) {
                    local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_288.field_2._8_8_ = puVar9[3];
                    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                  }
                  else {
                    local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                    local_288._M_dataplus._M_p = (pointer)*puVar9;
                  }
                  local_288._M_string_length = puVar9[1];
                  *puVar9 = paVar12;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)local_228,(ulong)local_288._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_288._M_dataplus._M_p != &local_288.field_2) {
                    operator_delete(local_288._M_dataplus._M_p,
                                    (ulong)(local_288.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_268._M_allocated_capacity != &local_258) {
                    operator_delete((void *)local_268._M_allocated_capacity,
                                    (ulong)(local_258._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                    operator_delete(local_1e0._M_dataplus._M_p,
                                    (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
                  }
                  uVar23 = local_248.field_2._M_allocated_capacity;
                  uVar25 = local_248._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
LAB_001b4a48:
                    operator_delete((void *)uVar25,
                                    (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name.
                                                   _M_dataplus._M_p + 1));
                  }
                }
                std::__cxx11::string::append((char *)local_228);
              }
            }
            break;
          case BASE_TYPE_STRUCT:
            if ((struct_def->fixed == true) && (((pFVar3->value).type.struct_def)->fixed == true)) {
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e0,local_178._M_allocated_capacity,
                         local_178._8_8_ + local_178._M_allocated_capacity);
              std::__cxx11::string::append((char *)&local_1e0);
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1e0,local_1c0._M_allocated_capacity);
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_258._8_8_ = puVar9[3];
                local_268._M_allocated_capacity = (size_type)&local_258;
              }
              else {
                local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_268._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar9;
              }
              local_268._8_8_ = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_288.field_2._8_8_ = puVar9[3];
                local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              }
              else {
                local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_288._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_288._M_string_length = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
              goto LAB_001b3846;
            }
            local_220._0_8_ = local_220 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_220,local_178._M_allocated_capacity,
                       local_178._8_8_ + local_178._M_allocated_capacity);
            std::__cxx11::string::append((char *)local_220);
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)local_220,local_1c0._M_allocated_capacity);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_248.field_2._8_8_ = puVar9[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_248._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_248._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_1e0.field_2._8_8_ = puVar9[3];
            }
            else {
              local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_1e0._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_1e0._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1e0,local_1c0._M_allocated_capacity);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_258._8_8_ = puVar9[3];
              local_268._M_allocated_capacity = (size_type)&local_258;
            }
            else {
              local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_268._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar9;
            }
            local_268._8_8_ = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288.field_2._8_8_ = puVar9[3];
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            }
            else {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_288._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,
                              (ulong)(local_288.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_allocated_capacity != &local_258) {
              operator_delete((void *)local_268._M_allocated_capacity,
                              (ulong)(local_258._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,
                              (ulong)(local_248.field_2._M_allocated_capacity + 1));
            }
            uVar23 = local_220._16_8_;
            _Var26._M_p = (pointer)local_220._0_8_;
            if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10))
            goto LAB_001b41ab;
            break;
          case BASE_TYPE_UNION:
            GenUnionUnPack_ObjectAPI
                      (local_138,(pFVar3->value).type.enum_def,local_228,(string *)&local_1c0,
                       &local_200,false);
            break;
          case BASE_TYPE_ARRAY:
            GenTypeGet_ObjectAPI_abi_cxx11_(&local_288,local_138,pVVar1->type,local_f0);
            NumToString<unsigned_short>((string *)&local_268,(pFVar3->value).type.fixed_length);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,local_178._M_allocated_capacity,
                       local_178._8_8_ + local_178._M_allocated_capacity);
            std::__cxx11::string::append((char *)&local_198);
            std::__cxx11::string::substr((ulong)&local_158,(ulong)&local_288);
            uVar23 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              uVar23 = local_198.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < (EnumDef *)(local_158._M_string_length + local_198._M_string_length)
               ) {
              uVar23 = (EnumDef *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                uVar23 = local_158.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar23 <
                  (EnumDef *)(local_158._M_string_length + local_198._M_string_length))
              goto LAB_001b366e;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_158,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p)
              ;
            }
            else {
LAB_001b366e:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_198,(ulong)local_158._M_dataplus._M_p);
            }
            local_220._0_8_ = local_220 + 0x10;
            p_Var17 = (_Alloc_hider *)(puVar9 + 2);
            if ((_Alloc_hider *)*puVar9 == p_Var17) {
              local_220._16_8_ = p_Var17->_M_p;
              _uStack_208 = puVar9[3];
            }
            else {
              local_220._16_8_ = p_Var17->_M_p;
              local_220._0_8_ = (_Alloc_hider *)*puVar9;
            }
            local_220._8_8_ = puVar9[1];
            *puVar9 = p_Var17;
            puVar9[1] = 0;
            *(undefined1 *)&p_Var17->_M_p = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_220,local_268._M_allocated_capacity);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            psVar14 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_248.field_2._M_allocated_capacity = *psVar14;
              local_248.field_2._8_8_ = plVar8[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = *psVar14;
              local_248._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_248._M_string_length = plVar8[1];
            *plVar8 = (long)psVar14;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_248);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            psVar14 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_1e0.field_2._M_allocated_capacity = *psVar14;
              local_1e0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_1e0.field_2._M_allocated_capacity = *psVar14;
              local_1e0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_1e0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar14;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_1e0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
              operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,
                              (ulong)(local_158.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              (ulong)(local_198.field_2._M_allocated_capacity + 1));
            }
            std::operator+(&local_e0,"    for (var _j = 0; _j < ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_268);
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_110.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_110.field_2._8_8_ = puVar9[3];
            }
            else {
              local_110.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_110._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_110._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_110,local_1c0._M_allocated_capacity);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 == paVar12) {
              local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_130.field_2._8_8_ = plVar8[3];
            }
            else {
              local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_130._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_130._M_string_length = plVar8[1];
            *plVar8 = (long)paVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_158.field_2._8_8_ = puVar9[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_158._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_158._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_158,local_1c0._M_allocated_capacity);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            plVar15 = plVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar15) {
              local_198.field_2._M_allocated_capacity = *plVar15;
              local_198.field_2._8_8_ = plVar8[3];
            }
            else {
              local_198.field_2._M_allocated_capacity = *plVar15;
              local_198._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_198._M_string_length = plVar8[1];
            *plVar8 = (long)plVar15;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
            local_220._0_8_ = local_220 + 0x10;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_220._16_8_ = paVar12->_M_allocated_capacity;
              _uStack_208 = puVar9[3];
            }
            else {
              local_220._16_8_ = paVar12->_M_allocated_capacity;
              local_220._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar9;
            }
            local_220._8_8_ = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_220);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_248.field_2._8_8_ = puVar9[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_248._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_248._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_1e0.field_2._8_8_ = puVar9[3];
            }
            else {
              local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_1e0._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_1e0._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_1e0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,
                              (ulong)(local_248.field_2._M_allocated_capacity + 1));
            }
            if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
              operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              (ulong)(local_198.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,
                              (ulong)(local_158.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,
                              (ulong)(local_130.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              (ulong)(local_110.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,
                              (ulong)(local_e0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_allocated_capacity != &local_258) {
              operator_delete((void *)local_268._M_allocated_capacity,
                              (ulong)(local_258._M_allocated_capacity + 1));
            }
            uVar23 = local_288.field_2._M_allocated_capacity;
            _Var26._M_p = local_288._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) goto LAB_001b41ab;
          }
        }
        else if (BVar2 != BASE_TYPE_UTYPE) {
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e0,local_178._M_allocated_capacity,
                     local_178._8_8_ + local_178._M_allocated_capacity);
          std::__cxx11::string::append((char *)&local_1e0);
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1e0,local_1c0._M_allocated_capacity);
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_258._8_8_ = puVar9[3];
            local_268._M_allocated_capacity = (size_type)&local_258;
          }
          else {
            local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_268._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar9;
          }
          local_268._8_8_ = puVar9[1];
          *puVar9 = paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288.field_2._8_8_ = puVar9[3];
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          }
          else {
            local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_288._M_string_length = puVar9[1];
          *puVar9 = paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
LAB_001b3846:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            (ulong)(local_288.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_allocated_capacity != &local_258) {
            operator_delete((void *)local_268._M_allocated_capacity,
                            (ulong)(local_258._M_allocated_capacity + 1));
          }
          uVar23 = local_1e0.field_2._M_allocated_capacity;
          _Var26._M_p = local_1e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
LAB_001b41ab:
            operator_delete(_Var26._M_p,
                            (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_allocated_capacity != &local_168) {
          operator_delete((void *)local_178._M_allocated_capacity,
                          local_168._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_allocated_capacity != &local_1b0) {
          operator_delete((void *)local_1c0._M_allocated_capacity,
                          local_1b0._M_allocated_capacity + 1);
        }
        ppFVar11 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar21 = ppFVar21 + 1;
    } while (ppFVar21 != ppFVar11);
  }
  std::__cxx11::string::append((char *)local_228);
  paVar12 = &local_200.field_2;
  GenOffsetType_abi_cxx11_((string *)&local_268,local_138,struct_def);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0x364f4c);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar13) {
    local_288.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_288.field_2._8_8_ = plVar8[3];
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_288._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_288._M_string_length = plVar8[1];
  *plVar8 = (long)paVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_178._M_allocated_capacity = (size_type)&local_168;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar13) {
    local_168._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_168._8_8_ = plVar8[3];
  }
  else {
    local_168._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_178._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_178._8_8_ = plVar8[1];
  *plVar8 = (long)paVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append(local_178._M_local_buf,(ulong)local_50._M_dataplus._M_p);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar13) {
    local_200.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_200.field_2._8_8_ = puVar9[3];
    local_200._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_200.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_200._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_200._M_string_length = puVar9[1];
  *puVar9 = paVar13;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar13) {
    local_1b0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1b0._8_8_ = puVar9[3];
    local_1c0._M_allocated_capacity = (size_type)&local_1b0;
  }
  else {
    local_1b0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1c0._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar9;
  }
  local_1c0._8_8_ = puVar9[1];
  *puVar9 = paVar13;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_allocated_capacity != &local_1b0) {
    operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar12) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_allocated_capacity != &local_168) {
    operator_delete((void *)local_178._M_allocated_capacity,local_168._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,(ulong)(local_288.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_allocated_capacity != &local_258) {
    operator_delete((void *)local_268._M_allocated_capacity,
                    (ulong)(local_258._M_allocated_capacity + 1));
  }
  GenOffsetType_abi_cxx11_((string *)&local_178,local_138,struct_def);
  puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x36543a);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar13) {
    local_200.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_200.field_2._8_8_ = puVar9[3];
    local_200._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_200.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_200._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_200._M_string_length = puVar9[1];
  *puVar9 = paVar13;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar13) {
    local_1b0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1b0._8_8_ = puVar9[3];
    local_1c0._M_allocated_capacity = (size_type)&local_1b0;
  }
  else {
    local_1b0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1c0._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar9;
  }
  local_1c0._8_8_ = puVar9[1];
  *puVar9 = paVar13;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_allocated_capacity != &local_1b0) {
    operator_delete((void *)local_1c0._M_allocated_capacity,
                    (ulong)(local_1b0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar12) {
    operator_delete(local_200._M_dataplus._M_p,(ulong)(local_200.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_allocated_capacity != &local_168) {
    operator_delete((void *)local_178._M_allocated_capacity,local_168._M_allocated_capacity + 1);
  }
  ppFVar21 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar21 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_c0 = &(local_b8->_M_t)._M_impl.super__Rb_tree_header._M_header;
    do {
      pFVar3 = *ppFVar21;
      if (pFVar3->deprecated != false) goto LAB_001b7331;
      Name_abi_cxx11_(&local_200,local_138,pFVar3);
      if ((local_200._M_string_length == (struct_def->super_Definition).name._M_string_length) &&
         ((local_200._M_string_length == 0 ||
          (iVar7 = bcmp(local_200._M_dataplus._M_p,
                        (struct_def->super_Definition).name._M_dataplus._M_p,
                        local_200._M_string_length), iVar7 == 0)))) {
        std::__cxx11::string::append((char *)&local_200);
      }
      Name_abi_cxx11_((string *)&local_178,local_138,pFVar3);
      BVar2 = (pFVar3->value).type.base_type;
      if (4 < BVar2 - BASE_TYPE_STRING) goto LAB_001b72e7;
      pVVar1 = &pFVar3->value;
      switch(BVar2) {
      case BASE_TYPE_STRING:
        pcVar22 = "CreateString";
        if (pFVar3->shared != false) {
          pcVar22 = "CreateSharedString";
        }
        local_1c0._M_allocated_capacity = (size_type)&local_1b0;
        pcVar19 = pcVar22 + 0xc;
        if (pFVar3->shared != false) {
          pcVar19 = pcVar22 + 0x12;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar22,pcVar19);
        std::operator+(&local_130,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_158.field_2._8_8_ = puVar9[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_158._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_158._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_158,(ulong)local_200._M_dataplus._M_p);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        puVar18 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_198.field_2._M_allocated_capacity = *puVar18;
          local_198.field_2._8_8_ = puVar9[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *puVar18;
          local_198._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_198._M_string_length = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_220._0_8_ = local_220 + 0x10;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_220._16_8_ = paVar12->_M_allocated_capacity;
          _uStack_208 = puVar9[3];
        }
        else {
          local_220._16_8_ = paVar12->_M_allocated_capacity;
          local_220._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_220._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)local_220,local_1c0._M_allocated_capacity);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_248.field_2._8_8_ = puVar9[3];
        }
        else {
          local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_248._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_248._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1e0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1e0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1e0._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1e0,(ulong)local_200._M_dataplus._M_p);
        local_268._M_allocated_capacity = (size_type)&local_258;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_258._8_8_ = puVar9[3];
        }
        else {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_268._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_268._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288.field_2._8_8_ = puVar9[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_288._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          (ulong)(local_288.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          (ulong)(local_258._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,
                          (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          (ulong)(local_248.field_2._M_allocated_capacity + 1));
        }
        if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          (ulong)(local_198.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          (ulong)(local_158.field_2._M_allocated_capacity + 1));
        }
        uVar23 = local_130.field_2._M_allocated_capacity;
        _Var26._M_p = local_130._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
LAB_001b581c:
          operator_delete(_Var26._M_p,
                          (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name._M_dataplus.
                                         _M_p + 1));
        }
        goto LAB_001b72c2;
      case BASE_TYPE_VECTOR:
        p_Var10 = (local_b8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var16 = local_c0;
        if (p_Var10 != (_Base_ptr)0x0) {
          do {
            if (*(FieldDef **)(p_Var10 + 1) >= pFVar3) {
              p_Var16 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[*(FieldDef **)(p_Var10 + 1) < pFVar3];
          } while (p_Var10 != (_Base_ptr)0x0);
          if ((p_Var16 != local_c0) && (*(FieldDef **)(p_Var16 + 1) <= pFVar3)) {
            local_1c0._M_allocated_capacity = (size_type)&local_1b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c0,local_200._M_dataplus._M_p,
                       local_200._M_dataplus._M_p + local_200._M_string_length);
            std::operator+(&local_288,"__",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar3);
            local_268._M_allocated_capacity = (size_type)&local_258;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"","");
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"","");
            BVar2 = (pFVar3->value).type.element;
            bVar6 = false;
            if ((int)BVar2 < 0xf) {
              if (BVar2 == BASE_TYPE_UTYPE) {
                std::__cxx11::string::substr((ulong)&local_248,(ulong)&local_200);
                std::__cxx11::string::operator=
                          ((string *)local_1c0._M_local_buf,(string *)&local_248);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  (ulong)(local_248.field_2._M_allocated_capacity + 1));
                }
                NamespacedName_abi_cxx11_
                          (&local_248,local_138,&((pFVar3->value).type.enum_def)->super_Definition);
                std::__cxx11::string::operator=
                          ((string *)local_268._M_local_buf,(string *)&local_248);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  (ulong)(local_248.field_2._M_allocated_capacity + 1));
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_220,"_o.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_1c0);
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_220);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_248.field_2._8_8_ = puVar9[3];
                  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                }
                else {
                  local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_248._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_248._M_string_length = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_248);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  (ulong)(local_248.field_2._M_allocated_capacity + 1));
                }
                uVar23 = local_220._16_8_;
                _Var26._M_p = (pointer)local_220._0_8_;
                if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10))
                goto LAB_001b7ac7;
                goto LAB_001b7acf;
              }
              if (BVar2 == BASE_TYPE_STRING) {
                pcVar22 = "CreateString";
                if (pFVar3->shared != false) {
                  pcVar22 = "CreateSharedString";
                }
                local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                pcVar19 = pcVar22 + 0xc;
                if (pFVar3->shared != false) {
                  pcVar19 = pcVar22 + 0x12;
                }
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_248,pcVar22,pcVar19);
                std::__cxx11::string::_M_replace
                          ((ulong)&local_268,0,(char *)local_268._8_8_,0x36396d);
                std::operator+(&local_130,"builder.",&local_248);
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_158.field_2._8_8_ = puVar9[3];
                }
                else {
                  local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_158._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_158._M_string_length = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                puVar9 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_158,local_1c0._M_allocated_capacity);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                puVar18 = puVar9 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar18) {
                  local_198.field_2._M_allocated_capacity = *puVar18;
                  local_198.field_2._8_8_ = puVar9[3];
                }
                else {
                  local_198.field_2._M_allocated_capacity = *puVar18;
                  local_198._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_198._M_string_length = puVar9[1];
                *puVar9 = puVar18;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
                local_220._0_8_ = local_220 + 0x10;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_220._16_8_ = paVar12->_M_allocated_capacity;
                  _uStack_208 = puVar9[3];
                }
                else {
                  local_220._16_8_ = paVar12->_M_allocated_capacity;
                  local_220._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar9;
                }
                local_220._8_8_ = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_1e0,local_220._0_8_);
                if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
                  operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  (ulong)(local_198.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  (ulong)(local_158.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  (ulong)(local_130.field_2._M_allocated_capacity + 1));
                }
                uVar23 = local_248.field_2._M_allocated_capacity;
                _Var26._M_p = local_248._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) goto LAB_001b7ac7;
                goto LAB_001b7acf;
              }
            }
            else {
              if (BVar2 == BASE_TYPE_STRUCT) {
                GenTypeGet_abi_cxx11_(&local_198,local_138,&pVVar1->type);
                puVar9 = (undefined8 *)
                         std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x364f02);
                local_220._0_8_ = local_220 + 0x10;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_220._16_8_ = paVar12->_M_allocated_capacity;
                  _uStack_208 = puVar9[3];
                }
                else {
                  local_220._16_8_ = paVar12->_M_allocated_capacity;
                  local_220._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar9;
                }
                local_220._8_8_ = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                plVar8 = (long *)std::__cxx11::string::append((char *)local_220);
                psVar14 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_248.field_2._M_allocated_capacity = *psVar14;
                  local_248.field_2._8_8_ = plVar8[3];
                  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                }
                else {
                  local_248.field_2._M_allocated_capacity = *psVar14;
                  local_248._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_248._M_string_length = plVar8[1];
                *plVar8 = (long)psVar14;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::operator=
                          ((string *)local_268._M_local_buf,(string *)&local_248);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  local_248.field_2._M_allocated_capacity + 1);
                }
                if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
                  operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  (ulong)(local_198.field_2._M_allocated_capacity + 1));
                }
                GenTypeGet_abi_cxx11_(&local_158,local_138,&pVVar1->type);
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                puVar18 = puVar9 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar18) {
                  local_198.field_2._M_allocated_capacity = *puVar18;
                  local_198.field_2._8_8_ = puVar9[3];
                }
                else {
                  local_198.field_2._M_allocated_capacity = *puVar18;
                  local_198._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_198._M_string_length = puVar9[1];
                *puVar9 = puVar18;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                puVar9 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_198,local_1c0._M_allocated_capacity);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_220._16_8_ = paVar12->_M_allocated_capacity;
                  _uStack_208 = puVar9[3];
                  local_220._0_8_ = (_Alloc_hider *)(local_220 + 0x10);
                }
                else {
                  local_220._16_8_ = paVar12->_M_allocated_capacity;
                  local_220._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar9;
                }
                local_220._8_8_ = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_220);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_248.field_2._8_8_ = puVar9[3];
                  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                }
                else {
                  local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_248._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_248._M_string_length = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_248);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  (ulong)(local_248.field_2._M_allocated_capacity + 1));
                }
                if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
LAB_001b7915:
                  operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
                }
              }
              else {
                if (BVar2 != BASE_TYPE_UNION) goto LAB_001b7ad2;
                std::__cxx11::string::_M_replace
                          ((ulong)&local_268,0,(char *)local_268._8_8_,0x35f906);
                NamespacedName_abi_cxx11_
                          (&local_158,local_138,&((pFVar3->value).type.enum_def)->super_Definition);
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                puVar18 = puVar9 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar18) {
                  local_198.field_2._M_allocated_capacity = *puVar18;
                  local_198.field_2._8_8_ = puVar9[3];
                }
                else {
                  local_198.field_2._M_allocated_capacity = *puVar18;
                  local_198._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_198._M_string_length = puVar9[1];
                *puVar9 = puVar18;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                puVar9 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_198,local_1c0._M_allocated_capacity);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_220._16_8_ = paVar12->_M_allocated_capacity;
                  _uStack_208 = puVar9[3];
                  local_220._0_8_ = (_Alloc_hider *)(local_220 + 0x10);
                }
                else {
                  local_220._16_8_ = paVar12->_M_allocated_capacity;
                  local_220._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar9;
                }
                local_220._8_8_ = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_220);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 == paVar12) {
                  local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_248.field_2._8_8_ = puVar9[3];
                  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                }
                else {
                  local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_248._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_248._M_string_length = puVar9[1];
                *puVar9 = paVar12;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_248);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  (ulong)(local_248.field_2._M_allocated_capacity + 1));
                }
                if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10))
                goto LAB_001b7915;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                (ulong)(local_198.field_2._M_allocated_capacity + 1));
              }
              uVar23 = local_158.field_2._M_allocated_capacity;
              _Var26._M_p = local_158._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_001b7ac7:
                operator_delete(_Var26._M_p,
                                (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name.
                                               _M_dataplus._M_p + 1));
              }
LAB_001b7acf:
              bVar6 = true;
            }
LAB_001b7ad2:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_220,"    var _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar3);
            plVar8 = (long *)std::__cxx11::string::append((char *)local_220);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            psVar14 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_248.field_2._M_allocated_capacity = *psVar14;
              local_248.field_2._8_8_ = plVar8[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = *psVar14;
              local_248._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_248._M_string_length = plVar8[1];
            *plVar8 = (long)psVar14;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
              operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_220,"    if (_o.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c0);
            plVar8 = (long *)std::__cxx11::string::append((char *)local_220);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            psVar14 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_248.field_2._M_allocated_capacity = *psVar14;
              local_248.field_2._8_8_ = plVar8[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = *psVar14;
              local_248._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_248._M_string_length = plVar8[1];
            *plVar8 = (long)psVar14;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
              operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
            }
            if (bVar6) {
              std::operator+(&local_110,"      var ",&local_288);
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_130.field_2._8_8_ = puVar9[3];
              }
              else {
                local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_130._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_130._M_string_length = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_130,local_268._M_allocated_capacity);
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_158.field_2._8_8_ = puVar9[3];
              }
              else {
                local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_158._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_158._M_string_length = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              puVar18 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar18) {
                local_198.field_2._M_allocated_capacity = *puVar18;
                local_198.field_2._8_8_ = puVar9[3];
              }
              else {
                local_198.field_2._M_allocated_capacity = *puVar18;
                local_198._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_198._M_string_length = puVar9[1];
              *puVar9 = puVar18;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_198,local_1c0._M_allocated_capacity);
              local_220._0_8_ = local_220 + 0x10;
              p_Var17 = (_Alloc_hider *)(plVar8 + 2);
              if ((_Alloc_hider *)*plVar8 == p_Var17) {
                local_220._16_8_ = p_Var17->_M_p;
                _uStack_208 = plVar8[3];
              }
              else {
                local_220._16_8_ = p_Var17->_M_p;
                local_220._0_8_ = (_Alloc_hider *)*plVar8;
              }
              local_220._8_8_ = plVar8[1];
              *plVar8 = (long)p_Var17;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)local_220);
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              psVar14 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_248.field_2._M_allocated_capacity = *psVar14;
                local_248.field_2._8_8_ = plVar8[3];
              }
              else {
                local_248.field_2._M_allocated_capacity = *psVar14;
                local_248._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_248._M_string_length = plVar8[1];
              *plVar8 = (long)psVar14;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
                operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                (ulong)(local_198.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                (ulong)(local_158.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                (ulong)(local_130.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                (ulong)(local_110.field_2._M_allocated_capacity + 1));
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_220,"      for (var _j = 0; _j < ",&local_288);
              plVar8 = (long *)std::__cxx11::string::append((char *)local_220);
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              psVar14 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_248.field_2._M_allocated_capacity = *psVar14;
                local_248.field_2._8_8_ = plVar8[3];
              }
              else {
                local_248.field_2._M_allocated_capacity = *psVar14;
                local_248._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_248._M_string_length = plVar8[1];
              *plVar8 = (long)psVar14;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
                operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
              }
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_198,local_288._M_dataplus._M_p,
                         local_288._M_dataplus._M_p + local_288._M_string_length);
              std::__cxx11::string::append((char *)&local_198);
              plVar8 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_198,(ulong)local_1e0._M_dataplus._M_p);
              local_220._0_8_ = local_220 + 0x10;
              p_Var17 = (_Alloc_hider *)(plVar8 + 2);
              if ((_Alloc_hider *)*plVar8 == p_Var17) {
                local_220._16_8_ = p_Var17->_M_p;
                _uStack_208 = plVar8[3];
              }
              else {
                local_220._16_8_ = p_Var17->_M_p;
                local_220._0_8_ = (_Alloc_hider *)*plVar8;
              }
              local_220._8_8_ = plVar8[1];
              *plVar8 = (long)p_Var17;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)local_220);
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              psVar14 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_248.field_2._M_allocated_capacity = *psVar14;
                local_248.field_2._8_8_ = plVar8[3];
              }
              else {
                local_248.field_2._M_allocated_capacity = *psVar14;
                local_248._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_248._M_string_length = plVar8[1];
              *plVar8 = (long)psVar14;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
                operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
              }
              uVar23 = local_198.field_2._M_allocated_capacity;
              _Var26._M_p = local_198._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
LAB_001b83ba:
                operator_delete(_Var26._M_p,
                                (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name.
                                               _M_dataplus._M_p + 1));
              }
            }
            else {
              std::operator+(&local_158,"      var ",&local_288);
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_198.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_198.field_2._8_8_ = puVar9[3];
              }
              else {
                local_198.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_198._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_198._M_string_length = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_198,local_1c0._M_allocated_capacity);
              local_220._0_8_ = local_220 + 0x10;
              p_Var17 = (_Alloc_hider *)(plVar8 + 2);
              if ((_Alloc_hider *)*plVar8 == p_Var17) {
                local_220._16_8_ = p_Var17->_M_p;
                _uStack_208 = plVar8[3];
              }
              else {
                local_220._16_8_ = p_Var17->_M_p;
                local_220._0_8_ = (_Alloc_hider *)*plVar8;
              }
              local_220._8_8_ = plVar8[1];
              *plVar8 = (long)p_Var17;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)local_220);
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              psVar14 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_248.field_2._M_allocated_capacity = *psVar14;
                local_248.field_2._8_8_ = plVar8[3];
              }
              else {
                local_248.field_2._M_allocated_capacity = *psVar14;
                local_248._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_248._M_string_length = plVar8[1];
              *plVar8 = (long)psVar14;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
                operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                (ulong)(local_198.field_2._M_allocated_capacity + 1));
              }
              uVar23 = local_158.field_2._M_allocated_capacity;
              _Var26._M_p = local_158._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) goto LAB_001b83ba;
            }
            std::operator+(&local_110,"      _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar3);
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_130.field_2._8_8_ = puVar9[3];
            }
            else {
              local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_130._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_130._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_130,local_178._M_allocated_capacity);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_158.field_2._8_8_ = puVar9[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_158._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_158._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            puVar18 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar18) {
              local_198.field_2._M_allocated_capacity = *puVar18;
              local_198.field_2._8_8_ = puVar9[3];
            }
            else {
              local_198.field_2._M_allocated_capacity = *puVar18;
              local_198._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_198._M_string_length = puVar9[1];
            *puVar9 = puVar18;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_198,(ulong)local_288._M_dataplus._M_p);
            local_220._0_8_ = local_220 + 0x10;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_220._16_8_ = paVar12->_M_allocated_capacity;
              _uStack_208 = puVar9[3];
            }
            else {
              local_220._16_8_ = paVar12->_M_allocated_capacity;
              local_220._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar9;
            }
            local_220._8_8_ = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_220);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_248.field_2._8_8_ = puVar9[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_248._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_248._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_248._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,
                              (ulong)(local_248.field_2._M_allocated_capacity + 1));
            }
            if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
              operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,
                              (ulong)(local_198.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,
                              (ulong)(local_158.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,
                              (ulong)(local_130.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              (ulong)(local_110.field_2._M_allocated_capacity + 1));
            }
            std::__cxx11::string::append((char *)local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_allocated_capacity != &local_258) {
              operator_delete((void *)local_268._M_allocated_capacity,
                              (ulong)(local_258._M_allocated_capacity + 1));
            }
            uVar23 = local_288.field_2._M_allocated_capacity;
            _Var26._M_p = local_288._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) goto LAB_001b581c;
            goto LAB_001b72c2;
          }
        }
        if ((pFVar3->value).type.struct_def == (StructDef *)0x0) {
          local_220._16_8_ = (pFVar3->value).type.enum_def;
          local_220._4_4_ = 0;
          local_220._0_4_ = (pFVar3->value).type.element;
          local_220._8_8_ = (StructDef *)0x0;
          uStack_208 = (pFVar3->value).type.fixed_length;
          GenMethod_abi_cxx11_(&local_248,local_138,(Type *)local_220);
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x364bde);
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_1e0.field_2._8_8_ = puVar9[3];
          }
          else {
            local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_1e0._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_1e0._M_string_length = puVar9[1];
          *puVar9 = paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e0);
          local_268._M_allocated_capacity = (size_type)&local_258;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar12) {
            local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_258._8_8_ = plVar8[3];
          }
          else {
            local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_268._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar8;
          }
          local_268._8_8_ = plVar8[1];
          *plVar8 = (long)paVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     (local_268._M_local_buf,(ulong)local_200._M_dataplus._M_p);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          psVar14 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_288.field_2._M_allocated_capacity = *psVar14;
            local_288.field_2._8_8_ = plVar8[3];
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar14;
            local_288._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_288._M_string_length = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
          local_1c0._M_allocated_capacity = (size_type)&local_1b0;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_1b0._8_8_ = puVar9[3];
          }
          else {
            local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_1c0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar9;
          }
          local_1c0._8_8_ = puVar9[1];
          *puVar9 = paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_allocated_capacity != &local_258) {
            operator_delete((void *)local_268._M_allocated_capacity,
                            local_258._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,
                            (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
          }
          uVar23 = local_248.field_2._M_allocated_capacity;
          _Var26._M_p = local_248._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) goto LAB_001b6cdc;
        }
        else {
          GenTypeGet_abi_cxx11_(&local_1e0,local_138,&pVVar1->type);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e0);
          local_268._M_allocated_capacity = (size_type)&local_258;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar12) {
            local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_258._8_8_ = plVar8[3];
          }
          else {
            local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_268._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar8;
          }
          local_268._8_8_ = plVar8[1];
          *plVar8 = (long)paVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     (local_268._M_local_buf,(ulong)local_200._M_dataplus._M_p);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          psVar14 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_288.field_2._M_allocated_capacity = *psVar14;
            local_288.field_2._8_8_ = plVar8[3];
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar14;
            local_288._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_288._M_string_length = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
          local_1c0._M_allocated_capacity = (size_type)&local_1b0;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_1b0._8_8_ = puVar9[3];
          }
          else {
            local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_1c0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar9;
          }
          local_1c0._8_8_ = puVar9[1];
          *puVar9 = paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_allocated_capacity != &local_258) {
            operator_delete((void *)local_268._M_allocated_capacity,
                            local_258._M_allocated_capacity + 1);
          }
          uVar23 = local_1e0.field_2._M_allocated_capacity;
          _Var26._M_p = local_1e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
LAB_001b6cdc:
            operator_delete(_Var26._M_p,
                            (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_268,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        psVar14 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288.field_2._8_8_ = plVar8[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_288._M_string_length = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          local_258._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_268,"    if (_o.",&local_200);
        plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        psVar14 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288.field_2._8_8_ = plVar8[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_288._M_string_length = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          local_258._M_allocated_capacity + 1);
        }
        std::operator+(&local_248,"      Start",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_178);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_248);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        psVar14 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_1e0.field_2._M_allocated_capacity = *psVar14;
          local_1e0.field_2._8_8_ = plVar8[3];
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar14;
          local_1e0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1e0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1e0,(ulong)local_200._M_dataplus._M_p);
        local_268._M_allocated_capacity = (size_type)&local_258;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 == paVar12) {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_258._8_8_ = plVar8[3];
        }
        else {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_268._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_268._8_8_ = plVar8[1];
        *plVar8 = (long)paVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        psVar14 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288.field_2._8_8_ = plVar8[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_288._M_string_length = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          local_258._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          (ulong)(local_248.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_248,"      for (var _j = _o.",&local_200);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1e0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1e0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1e0._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_1e0,local_1c0._M_allocated_capacity)
        ;
        local_268._M_allocated_capacity = (size_type)&local_258;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_258._8_8_ = puVar9[3];
        }
        else {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_268._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_268._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        psVar14 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288.field_2._8_8_ = plVar8[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_288._M_string_length = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          (ulong)(local_258._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,
                          (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          (ulong)(local_248.field_2._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_268,"      _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288.field_2._8_8_ = puVar9[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_288._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,(ulong)local_288._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          (ulong)(local_288.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          (ulong)(local_258._M_allocated_capacity + 1));
        }
        std::__cxx11::string::append((char *)local_228);
LAB_001b72c2:
        uVar23 = local_1b0._M_allocated_capacity;
        uVar25 = local_1c0._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_allocated_capacity != &local_1b0) {
LAB_001b72df:
          operator_delete((void *)uVar25,
                          (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name._M_dataplus.
                                         _M_p + 1));
        }
        break;
      case BASE_TYPE_STRUCT:
        if (((pFVar3->value).type.struct_def)->fixed != false) {
          if ((struct_def->fixed & (byte)local_e4) == 1) {
            local_288._M_dataplus._M_p = (pointer)0x0;
            local_288._M_string_length = 0;
            local_288.field_2._M_allocated_capacity = 0;
            local_1c0._M_allocated_capacity = (size_type)&local_1b0;
            pcVar5 = (pFVar3->super_Definition).name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c0,pcVar5,
                       pcVar5 + (pFVar3->super_Definition).name._M_string_length);
            local_1a0 = (uint)(pFVar3->value).type.fixed_length;
            std::
            vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
            ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                         *)&local_288,(value_type *)&local_1c0);
            GenStructPackDecl_ObjectAPI
                      (local_138,(pFVar3->value).type.struct_def,local_228,
                       (vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                        *)&local_288);
            goto LAB_001b50e3;
          }
          break;
        }
        std::operator+(&local_110,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_130.field_2._8_8_ = puVar9[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_130._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_130._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_130,(ulong)local_200._M_dataplus._M_p);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_158.field_2._8_8_ = puVar9[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_158._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_158._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        puVar18 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_198.field_2._M_allocated_capacity = *puVar18;
          local_198.field_2._8_8_ = puVar9[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *puVar18;
          local_198._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_198._M_string_length = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        GenOffsetType_abi_cxx11_(&local_e0,local_138,(pFVar3->value).type.struct_def);
        uVar23 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          uVar23 = local_198.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar23 < (EnumDef *)(local_e0._M_string_length + local_198._M_string_length)) {
          uVar23 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            uVar23 = local_e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < (EnumDef *)(local_e0._M_string_length + local_198._M_string_length))
          goto LAB_001b6511;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_e0,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
        }
        else {
LAB_001b6511:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_198,(ulong)local_e0._M_dataplus._M_p);
        }
        local_220._0_8_ = local_220 + 0x10;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_220._16_8_ = paVar12->_M_allocated_capacity;
          _uStack_208 = puVar9[3];
        }
        else {
          local_220._16_8_ = paVar12->_M_allocated_capacity;
          local_220._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_220._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        paVar12->_M_local_buf[0] = '\0';
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_220);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_248.field_2._8_8_ = puVar9[3];
        }
        else {
          local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_248._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_248._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        GenTypeGet_abi_cxx11_(&local_70,local_138,&pVVar1->type);
        uVar23 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          uVar23 = local_248.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar23 < (EnumDef *)(local_70._M_string_length + local_248._M_string_length)) {
          uVar23 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar23 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < (EnumDef *)(local_70._M_string_length + local_248._M_string_length))
          goto LAB_001b67d7;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_70,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
        }
        else {
LAB_001b67d7:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_248,(ulong)local_70._M_dataplus._M_p);
        }
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1e0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1e0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1e0._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        paVar12->_M_local_buf[0] = '\0';
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
        local_268._M_allocated_capacity = (size_type)&local_258;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_258._8_8_ = puVar9[3];
        }
        else {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_268._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_268._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (local_268._M_local_buf,(ulong)local_200._M_dataplus._M_p);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288.field_2._8_8_ = puVar9[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_288._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
        local_1c0._M_allocated_capacity = (size_type)&local_1b0;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1b0._8_8_ = puVar9[3];
        }
        else {
          local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1c0._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_1c0._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_allocated_capacity != &local_1b0) {
          operator_delete((void *)local_1c0._M_allocated_capacity,
                          (ulong)(local_1b0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          (ulong)(local_288.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          (ulong)(local_258._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,
                          (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          (ulong)(local_70.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          (ulong)(local_248.field_2._M_allocated_capacity + 1));
        }
        if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          (ulong)(local_198.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          (ulong)(local_158.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        uVar23 = local_110.field_2._M_allocated_capacity;
        uVar25 = local_110._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p == &local_110.field_2) break;
        goto LAB_001b72df;
      case BASE_TYPE_UNION:
        std::operator+(&local_130,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_158.field_2._8_8_ = puVar9[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_158._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_158._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_158,(ulong)local_200._M_dataplus._M_p);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        psVar14 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_198.field_2._M_allocated_capacity = *psVar14;
          local_198.field_2._8_8_ = plVar8[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *psVar14;
          local_198._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_198._M_string_length = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_220._0_8_ = local_220 + 0x10;
        p_Var17 = (_Alloc_hider *)(puVar9 + 2);
        if ((_Alloc_hider *)*puVar9 == p_Var17) {
          local_220._16_8_ = p_Var17->_M_p;
          _uStack_208 = puVar9[3];
        }
        else {
          local_220._16_8_ = p_Var17->_M_p;
          local_220._0_8_ = (_Alloc_hider *)*puVar9;
        }
        local_220._8_8_ = puVar9[1];
        *puVar9 = p_Var17;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        NamespacedName_abi_cxx11_
                  (&local_110,local_138,&((pFVar3->value).type.enum_def)->super_Definition);
        pEVar24 = (EnumDef *)0xf;
        if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
          pEVar24 = (EnumDef *)local_220._16_8_;
        }
        pEVar27 = (EnumDef *)
                  ((long)&(((Definition *)local_220._8_8_)->name)._M_dataplus._M_p +
                  local_110._M_string_length);
        if (pEVar24 < pEVar27) {
          uVar23 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            uVar23 = local_110.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < pEVar27) goto LAB_001b54dd;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,local_220._0_8_);
        }
        else {
LAB_001b54dd:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)local_220,(ulong)local_110._M_dataplus._M_p);
        }
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        psVar14 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_248.field_2._M_allocated_capacity = *psVar14;
          local_248.field_2._8_8_ = puVar9[3];
        }
        else {
          local_248.field_2._M_allocated_capacity = *psVar14;
          local_248._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_248._M_string_length = puVar9[1];
        *puVar9 = psVar14;
        puVar9[1] = 0;
        *(undefined1 *)psVar14 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_248);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        psVar14 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_1e0.field_2._M_allocated_capacity = *psVar14;
          local_1e0.field_2._8_8_ = plVar8[3];
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar14;
          local_1e0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1e0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        local_268._M_allocated_capacity = (size_type)&local_258;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 == paVar12) {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_258._8_8_ = plVar8[3];
        }
        else {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_268._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_268._8_8_ = plVar8[1];
        *plVar8 = (long)paVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   (local_268._M_local_buf,(ulong)local_200._M_dataplus._M_p);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        psVar14 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288.field_2._8_8_ = plVar8[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar14;
          local_288._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_288._M_string_length = plVar8[1];
        *plVar8 = (long)psVar14;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_288);
        local_1c0._M_allocated_capacity = (size_type)&local_1b0;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 == paVar12) {
          local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1b0._8_8_ = plVar8[3];
        }
        else {
          local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1c0._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_1c0._8_8_ = plVar8[1];
        *plVar8 = (long)paVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_allocated_capacity != &local_1b0) {
          operator_delete((void *)local_1c0._M_allocated_capacity,
                          local_1b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          local_258._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          (ulong)(local_110.field_2._M_allocated_capacity + 1));
        }
        if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          (ulong)(local_158.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_158,"    var _",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        puVar18 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar18) {
          local_198.field_2._M_allocated_capacity = *puVar18;
          local_198.field_2._8_8_ = puVar9[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *puVar18;
          local_198._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_198._M_string_length = puVar9[1];
        *puVar9 = puVar18;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_198,(ulong)local_200._M_dataplus._M_p);
        local_220._0_8_ = local_220 + 0x10;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_220._16_8_ = paVar12->_M_allocated_capacity;
          _uStack_208 = puVar9[3];
        }
        else {
          local_220._16_8_ = paVar12->_M_allocated_capacity;
          local_220._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_220._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_220);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_248.field_2._8_8_ = puVar9[3];
        }
        else {
          local_248.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_248._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_248._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        GenTypeGet_ObjectAPI_abi_cxx11_(&local_130,local_138,pVVar1->type,local_f0);
        uVar23 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          uVar23 = local_248.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar23 < (EnumDef *)(local_130._M_string_length + local_248._M_string_length)) {
          uVar23 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            uVar23 = local_130.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < (EnumDef *)(local_130._M_string_length + local_248._M_string_length))
          goto LAB_001b5dff;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_130,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
        }
        else {
LAB_001b5dff:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_248,(ulong)local_130._M_dataplus._M_p);
        }
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1e0.field_2._8_8_ = puVar9[3];
        }
        else {
          local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1e0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1e0._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        paVar12->_M_local_buf[0] = '\0';
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
        local_268._M_allocated_capacity = (size_type)&local_258;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_258._8_8_ = puVar9[3];
        }
        else {
          local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_268._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_268._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (local_268._M_local_buf,(ulong)local_200._M_dataplus._M_p);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288.field_2._8_8_ = puVar9[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_288._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_288._M_string_length = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
        local_1c0._M_allocated_capacity = (size_type)&local_1b0;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar12) {
          local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1b0._8_8_ = puVar9[3];
        }
        else {
          local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_1c0._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_1c0._8_8_ = puVar9[1];
        *puVar9 = paVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_allocated_capacity != &local_1b0) {
          operator_delete((void *)local_1c0._M_allocated_capacity,
                          (ulong)(local_1b0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          (ulong)(local_288.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_allocated_capacity != &local_258) {
          operator_delete((void *)local_268._M_allocated_capacity,
                          (ulong)(local_258._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,
                          (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          (ulong)(local_248.field_2._M_allocated_capacity + 1));
        }
        if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          (ulong)(local_198.field_2._M_allocated_capacity + 1));
        }
        uVar23 = local_158.field_2._M_allocated_capacity;
        uVar25 = local_158._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) goto LAB_001b72df;
        break;
      case BASE_TYPE_ARRAY:
        if ((pFVar3->value).type.struct_def == (StructDef *)0x0) {
          std::operator+(&local_1e0,"    var _",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar3
                        );
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
          local_268._M_allocated_capacity = (size_type)&local_258;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_258._8_8_ = puVar9[3];
          }
          else {
            local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_268._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar9;
          }
          local_268._8_8_ = puVar9[1];
          *puVar9 = paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             (local_268._M_local_buf,(ulong)local_200._M_dataplus._M_p);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288.field_2._8_8_ = puVar9[3];
          }
          else {
            local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_288._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_288._M_string_length = puVar9[1];
          *puVar9 = paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
          local_1c0._M_allocated_capacity = (size_type)&local_1b0;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_1b0._8_8_ = puVar9[3];
          }
          else {
            local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_1c0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar9;
          }
          local_1c0._8_8_ = puVar9[1];
          *puVar9 = paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_allocated_capacity != &local_1b0) {
            operator_delete((void *)local_1c0._M_allocated_capacity,
                            (ulong)(local_1b0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            (ulong)(local_288.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_allocated_capacity != &local_258) {
            operator_delete((void *)local_268._M_allocated_capacity,
                            (ulong)(local_258._M_allocated_capacity + 1));
          }
          uVar23 = local_1e0.field_2._M_allocated_capacity;
          uVar25 = local_1e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) goto LAB_001b72df;
        }
        else {
          local_288._M_dataplus._M_p = (pointer)0x0;
          local_288._M_string_length = 0;
          local_288.field_2._M_allocated_capacity = 0;
          local_1c0._M_allocated_capacity = (size_type)&local_1b0;
          pcVar5 = (pFVar3->super_Definition).name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c0,pcVar5,
                     pcVar5 + (pFVar3->super_Definition).name._M_string_length);
          local_1a0 = (uint)(pFVar3->value).type.fixed_length;
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::push_back((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                       *)&local_288,(value_type *)&local_1c0);
          GenStructPackDecl_ObjectAPI
                    (local_138,(pFVar3->value).type.struct_def,local_228,
                     (vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                      *)&local_288);
LAB_001b50e3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_allocated_capacity != &local_1b0) {
            operator_delete((void *)local_1c0._M_allocated_capacity,
                            (ulong)(local_1b0._M_allocated_capacity + 1));
          }
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::~vector((vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                     *)&local_288);
        }
      }
LAB_001b72e7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_allocated_capacity != &local_168) {
        operator_delete((void *)local_178._M_allocated_capacity,local_168._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,
                        (ulong)(local_200.field_2._M_allocated_capacity + 1));
      }
LAB_001b7331:
      ppFVar21 = ppFVar21 + 1;
    } while (ppFVar21 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((byte)local_e4 == '\0') {
    std::operator+(&local_200,"    Start",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar12) {
      local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1b0._8_8_ = plVar8[3];
      local_1c0._M_allocated_capacity = (size_type)&local_1b0;
    }
    else {
      local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1c0._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_1c0._8_8_ = plVar8[1];
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_allocated_capacity != &local_1b0) {
      operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,
                      (ulong)(local_200.field_2._M_allocated_capacity + 1));
    }
    ppFVar21 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar11 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar21 != ppFVar11) {
      do {
        pFVar3 = *ppFVar21;
        if (pFVar3->deprecated == false) {
          Name_abi_cxx11_((string *)&local_1c0,local_138,pFVar3);
          BVar2 = (pFVar3->value).type.base_type;
          switch(BVar2) {
          case BASE_TYPE_STRING:
          case BASE_TYPE_VECTOR:
          case BASE_TYPE_ARRAY:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_268,"    Add",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c0);
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288.field_2._8_8_ = puVar9[3];
            }
            else {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_288._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_288,
                                        (ulong)(pFVar3->super_Definition).name._M_dataplus._M_p);
            local_178._M_allocated_capacity = (size_type)&local_168;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 == paVar12) {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_168._8_8_ = plVar8[3];
            }
            else {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_178._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar8;
            }
            local_178._8_8_ = plVar8[1];
            *plVar8 = (long)paVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_178._M_local_buf);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200.field_2._8_8_ = puVar9[3];
            }
            else {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_200._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
            break;
          case BASE_TYPE_STRUCT:
            if (((pFVar3->value).type.struct_def)->fixed != true) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_268,"    Add",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1c0);
              puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_288.field_2._8_8_ = puVar9[3];
              }
              else {
                local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_288._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_288._M_string_length = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_288,
                                  (ulong)(pFVar3->super_Definition).name._M_dataplus._M_p);
              local_178._M_allocated_capacity = (size_type)&local_168;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_168._8_8_ = puVar9[3];
              }
              else {
                local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_178._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar9;
              }
              local_178._8_8_ = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)std::__cxx11::string::append(local_178._M_local_buf);
              local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_200.field_2._8_8_ = puVar9[3];
              }
              else {
                local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_200._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_200._M_string_length = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
              break;
            }
            std::operator+(&local_248,"    Add",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c0);
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_1e0.field_2._8_8_ = puVar9[3];
            }
            else {
              local_1e0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_1e0._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_1e0._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            GenTypeGet_abi_cxx11_((string *)local_220,local_138,&(pFVar3->value).type);
            uVar23 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              uVar23 = local_1e0.field_2._M_allocated_capacity;
            }
            pEVar24 = (EnumDef *)
                      ((long)&(((Definition *)local_220._8_8_)->name)._M_dataplus._M_p +
                      local_1e0._M_string_length);
            if ((ulong)uVar23 < pEVar24) {
              pEVar27 = (EnumDef *)0xf;
              if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
                pEVar27 = (EnumDef *)local_220._16_8_;
              }
              if (pEVar27 < pEVar24) goto LAB_001b98b8;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)local_220,0,(char *)0x0,(ulong)local_1e0._M_dataplus._M_p);
            }
            else {
LAB_001b98b8:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_1e0,local_220._0_8_);
            }
            local_268._M_allocated_capacity = (size_type)&local_258;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_258._8_8_ = puVar9[3];
            }
            else {
              local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_268._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar9;
            }
            local_268._8_8_ = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            paVar12->_M_local_buf[0] = '\0';
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288.field_2._8_8_ = puVar9[3];
            }
            else {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_288._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_288,local_1c0._M_allocated_capacity);
            local_178._M_allocated_capacity = (size_type)&local_168;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_168._8_8_ = puVar9[3];
            }
            else {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_178._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar9;
            }
            local_178._8_8_ = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_178._M_local_buf);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200.field_2._8_8_ = puVar9[3];
            }
            else {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_200._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,
                              (ulong)(local_200.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_allocated_capacity != &local_168) {
              operator_delete((void *)local_178._M_allocated_capacity,
                              local_168._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,
                              (ulong)(local_288.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_allocated_capacity != &local_258) {
              operator_delete((void *)local_268._M_allocated_capacity,
                              (ulong)(local_258._M_allocated_capacity + 1));
            }
            if ((_Alloc_hider *)local_220._0_8_ != (_Alloc_hider *)(local_220 + 0x10)) {
              operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              (ulong)(local_1e0.field_2._M_allocated_capacity + 1));
            }
            uVar23 = local_248.field_2._M_allocated_capacity;
            uVar25 = local_248._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p == &local_248.field_2) goto LAB_001b9a57;
            goto LAB_001b9a4f;
          case BASE_TYPE_UNION:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_268,"    Add",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c0);
            plVar8 = (long *)std::__cxx11::string::append(local_268._M_local_buf);
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            psVar14 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_288.field_2._M_allocated_capacity = *psVar14;
              local_288.field_2._8_8_ = plVar8[3];
            }
            else {
              local_288.field_2._M_allocated_capacity = *psVar14;
              local_288._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_288._M_string_length = plVar8[1];
            *plVar8 = (long)psVar14;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_288,
                                        (ulong)(pFVar3->super_Definition).name._M_dataplus._M_p);
            local_178._M_allocated_capacity = (size_type)&local_168;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 == paVar12) {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_168._8_8_ = plVar8[3];
            }
            else {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_178._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar8;
            }
            local_178._8_8_ = plVar8[1];
            *plVar8 = (long)paVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append(local_178._M_local_buf);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 == paVar12) {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200.field_2._8_8_ = plVar8[3];
            }
            else {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_200._M_string_length = plVar8[1];
            *plVar8 = (long)paVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_allocated_capacity != &local_168) {
              operator_delete((void *)local_178._M_allocated_capacity,
                              local_168._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_allocated_capacity != &local_258) {
              operator_delete((void *)local_268._M_allocated_capacity,
                              (ulong)(local_258._M_allocated_capacity + 1));
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_268,"    Add",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c0);
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288.field_2._8_8_ = puVar9[3];
            }
            else {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_288._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_288,
                                (ulong)(pFVar3->super_Definition).name._M_dataplus._M_p);
            local_178._M_allocated_capacity = (size_type)&local_168;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_168._8_8_ = puVar9[3];
            }
            else {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_178._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar9;
            }
            local_178._8_8_ = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_178._M_local_buf);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200.field_2._8_8_ = puVar9[3];
            }
            else {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_200._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
            break;
          default:
            if (BVar2 != BASE_TYPE_UTYPE) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_268,"    Add",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1c0);
              puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_288.field_2._8_8_ = puVar9[3];
              }
              else {
                local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_288._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_288._M_string_length = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_288,local_1c0._M_allocated_capacity);
              local_178._M_allocated_capacity = (size_type)&local_168;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_168._8_8_ = puVar9[3];
              }
              else {
                local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_178._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar9;
              }
              local_178._8_8_ = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)std::__cxx11::string::append(local_178._M_local_buf);
              local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 == paVar12) {
                local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_200.field_2._8_8_ = puVar9[3];
              }
              else {
                local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_200._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_200._M_string_length = puVar9[1];
              *puVar9 = paVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
              break;
            }
            goto LAB_001b9a57;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,
                            (ulong)(local_200.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_allocated_capacity != &local_168) {
            operator_delete((void *)local_178._M_allocated_capacity,
                            local_168._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,
                            (ulong)(local_288.field_2._M_allocated_capacity + 1));
          }
          uVar23 = local_258._M_allocated_capacity;
          uVar25 = local_268._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_allocated_capacity != &local_258) {
LAB_001b9a4f:
            operator_delete((void *)uVar25,
                            (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
LAB_001b9a57:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_allocated_capacity != &local_1b0) {
            operator_delete((void *)local_1c0._M_allocated_capacity,
                            local_1b0._M_allocated_capacity + 1);
          }
          ppFVar11 = (struct_def->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        ppFVar21 = ppFVar21 + 1;
      } while (ppFVar21 != ppFVar11);
    }
    std::operator+(&local_200,"    return End",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar12) {
      local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1b0._8_8_ = plVar8[3];
      local_1c0._M_allocated_capacity = (size_type)&local_1b0;
    }
    else {
      local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1c0._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_1c0._8_8_ = plVar8[1];
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_allocated_capacity != &local_1b0) {
      operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
    }
    psVar20 = local_228;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,
                      (ulong)(local_200.field_2._M_allocated_capacity + 1));
      psVar20 = local_228;
    }
  }
  else {
    std::operator+(&local_200,"    return Create",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar12) {
      local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1b0._8_8_ = plVar8[3];
      local_1c0._M_allocated_capacity = (size_type)&local_1b0;
    }
    else {
      local_1b0._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1c0._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_1c0._8_8_ = plVar8[1];
    *plVar8 = (long)paVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_228,local_1c0._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_allocated_capacity != &local_1b0) {
      operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,
                      (ulong)(local_200.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::string::append((char *)local_228);
    ppFVar21 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar11 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar21 != ppFVar11) {
      do {
        pFVar3 = *ppFVar21;
        if (pFVar3->deprecated == false) {
          Name_abi_cxx11_((string *)&local_1c0,local_138,pFVar3);
          if ((local_1c0._8_8_ == (struct_def->super_Definition).name._M_string_length) &&
             ((local_1c0._8_8_ == 0 ||
              (iVar7 = bcmp((void *)local_1c0._M_allocated_capacity,
                            (struct_def->super_Definition).name._M_dataplus._M_p,local_1c0._8_8_),
              iVar7 == 0)))) {
            std::__cxx11::string::append(local_1c0._M_local_buf);
          }
          BVar2 = (pFVar3->value).type.base_type;
          switch(BVar2) {
          case BASE_TYPE_STRING:
          case BASE_TYPE_VECTOR:
          case BASE_TYPE_UNION:
switchD_001b8a15_caseD_d:
            std::__cxx11::string::append((char *)local_228);
            std::operator+(&local_200,"      _",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar3);
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
            break;
          case BASE_TYPE_STRUCT:
            if (struct_def->fixed == true) {
              pSVar4 = (pFVar3->value).type.struct_def;
              std::operator+(&local_200,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar3);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              psVar14 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_90.field_2._M_allocated_capacity = *psVar14;
                local_90.field_2._8_8_ = plVar8[3];
              }
              else {
                local_90.field_2._M_allocated_capacity = *psVar14;
                local_90._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_90._M_string_length = plVar8[1];
              *plVar8 = (long)psVar14;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              GenStructPackCall_ObjectAPI(local_138,pSVar4,local_228,&local_90);
              uVar23 = local_90.field_2._M_allocated_capacity;
              _Var26._M_p = local_90._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_001b8dbd:
                operator_delete(_Var26._M_p,uVar23 + 1);
              }
              break;
            }
            std::__cxx11::string::append((char *)local_228);
            if (((pFVar3->value).type.struct_def)->fixed != true) {
              std::operator+(&local_200,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar3);
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
              break;
            }
            if (local_f0->generate_object_based_api == true) {
              std::operator+(&local_200,"      _o.",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1c0);
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
              break;
            }
            GenTypeGet_abi_cxx11_(&local_1e0,local_138,&(pFVar3->value).type);
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,0x360847);
            local_268._M_allocated_capacity = (size_type)&local_258;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_258._8_8_ = puVar9[3];
            }
            else {
              local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_268._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar9;
            }
            local_268._8_8_ = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_268._M_local_buf);
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288.field_2._8_8_ = puVar9[3];
            }
            else {
              local_288.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_288._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_288._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_288,local_1c0._M_allocated_capacity);
            local_178._M_allocated_capacity = (size_type)&local_168;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 == paVar12) {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_168._8_8_ = plVar8[3];
            }
            else {
              local_168._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_178._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar8;
            }
            local_178._8_8_ = plVar8[1];
            *plVar8 = (long)paVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append(local_178._M_local_buf);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 == paVar12) {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200.field_2._8_8_ = puVar9[3];
            }
            else {
              local_200.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_200._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_200._M_string_length = puVar9[1];
            *puVar9 = paVar12;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,
                              (ulong)(local_200.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_allocated_capacity != &local_168) {
              operator_delete((void *)local_178._M_allocated_capacity,
                              local_168._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,
                              (ulong)(local_288.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_allocated_capacity != &local_258) {
              operator_delete((void *)local_268._M_allocated_capacity,
                              (ulong)(local_258._M_allocated_capacity + 1));
            }
            uVar23 = local_1e0.field_2._M_allocated_capacity;
            _Var26._M_p = local_1e0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) goto LAB_001b8af1;
            goto LAB_001b8af9;
          case BASE_TYPE_ARRAY:
            pSVar4 = (pFVar3->value).type.struct_def;
            if (pSVar4 == (StructDef *)0x0) {
              std::__cxx11::string::append((char *)local_228);
              std::operator+(&local_200,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar3);
              std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
            }
            else {
              std::operator+(&local_200,"      _",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pFVar3);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_200);
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              psVar14 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_b0.field_2._M_allocated_capacity = *psVar14;
                local_b0.field_2._8_8_ = plVar8[3];
              }
              else {
                local_b0.field_2._M_allocated_capacity = *psVar14;
                local_b0._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_b0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar14;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              GenStructPackCall_ObjectAPI(local_138,pSVar4,local_228,&local_b0);
              uVar23 = local_b0.field_2._M_allocated_capacity;
              _Var26._M_p = local_b0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_001b8dbd;
            }
            break;
          default:
            if (BVar2 == BASE_TYPE_UTYPE) goto switchD_001b8a15_caseD_d;
            std::__cxx11::string::append((char *)local_228);
            std::operator+(&local_200,"      _o.",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c0);
            std::__cxx11::string::_M_append((char *)local_228,(ulong)local_200._M_dataplus._M_p);
          }
          uVar23 = local_200.field_2._M_allocated_capacity;
          _Var26._M_p = local_200._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
LAB_001b8af1:
            operator_delete(_Var26._M_p,
                            (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
LAB_001b8af9:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_allocated_capacity != &local_1b0) {
            operator_delete((void *)local_1c0._M_allocated_capacity,
                            local_1b0._M_allocated_capacity + 1);
          }
          ppFVar11 = (struct_def->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        ppFVar21 = ppFVar21 + 1;
      } while (ppFVar21 != ppFVar11);
    }
    psVar20 = local_228;
    std::__cxx11::string::append((char *)local_228);
  }
  std::__cxx11::string::append((char *)psVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenPackUnPack_ObjectAPI(
      StructDef &struct_def, std::string *code_ptr, const IDLOptions &opts,
      bool struct_has_create,
      const std::set<FieldDef *> &field_has_create) const {
    auto &code = *code_ptr;
    auto struct_name = GenTypeName_ObjectAPI(struct_def.name, opts);
    // UnPack()
    code += "  public " + struct_name + " UnPack() {\n";
    code += "    var _o = new " + struct_name + "();\n";
    code += "    this.UnPackTo(_o);\n";
    code += "    return _o;\n";
    code += "  }\n";
    // UnPackTo()
    code += "  public void UnPackTo(" + struct_name + " _o) {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      auto camel_name_short = Name(field);
      auto start = "    _o." + camel_name + " = ";
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT: {
          auto fixed = struct_def.fixed && field.value.type.struct_def->fixed;
          if (fixed) {
            code += start + "this." + camel_name + ".UnPack();\n";
          } else {
            code += start + "this." + camel_name + ".HasValue ? this." +
                    camel_name + ".Value.UnPack() : null;\n";
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          auto type_name = GenTypeGet_ObjectAPI(field.value.type, opts);
          auto length_str = NumToString(field.value.type.fixed_length);
          auto unpack_method = field.value.type.struct_def == nullptr ? ""
                               : field.value.type.struct_def->fixed
                                   ? ".UnPack()"
                                   : "?.UnPack()";
          code += start + "new " + type_name.substr(0, type_name.length() - 1) +
                  length_str + "];\n";
          code += "    for (var _j = 0; _j < " + length_str + "; ++_j) { _o." +
                  camel_name + "[_j] = this." + camel_name + "(_j)" +
                  unpack_method + "; }\n";
          break;
        }
        case BASE_TYPE_VECTOR:
          if (field.value.type.element == BASE_TYPE_UNION) {
            code += start + "new " +
                    GenTypeGet_ObjectAPI(field.value.type, opts) + "();\n";
            code += "    for (var _j = 0; _j < this." + camel_name +
                    "Length; ++_j) {\n";
            GenUnionUnPack_ObjectAPI(*field.value.type.enum_def, code_ptr,
                                     camel_name, camel_name_short, true);
            code += "    }\n";
          } else if (field.value.type.element != BASE_TYPE_UTYPE) {
            auto fixed = field.value.type.struct_def == nullptr;
            code += start + "new " +
                    GenTypeGet_ObjectAPI(field.value.type, opts) + "();\n";
            code += "    for (var _j = 0; _j < this." + camel_name +
                    "Length; ++_j) {";
            code += "_o." + camel_name + ".Add(";
            if (fixed) {
              code += "this." + camel_name + "(_j)";
            } else {
              code += "this." + camel_name + "(_j).HasValue ? this." +
                      camel_name + "(_j).Value.UnPack() : null";
            }
            code += ");}\n";
          }
          break;
        case BASE_TYPE_UTYPE: break;
        case BASE_TYPE_UNION: {
          GenUnionUnPack_ObjectAPI(*field.value.type.enum_def, code_ptr,
                                   camel_name, camel_name_short, false);
          break;
        }
        default: {
          code += start + "this." + camel_name + ";\n";
          break;
        }
      }
    }
    code += "  }\n";
    // Pack()
    code += "  public static " + GenOffsetType(struct_def) +
            " Pack(FlatBufferBuilder builder, " + struct_name + " _o) {\n";
    code += "    if (_o == null) return default(" + GenOffsetType(struct_def) +
            ");\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      auto camel_name = Name(field);
      if (camel_name == struct_def.name) { camel_name += "_"; }
      auto camel_name_short = Name(field);
      // pre
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT: {
          if (!field.value.type.struct_def->fixed) {
            code += "    var _" + field.name + " = _o." + camel_name +
                    " == null ? default(" +
                    GenOffsetType(*field.value.type.struct_def) +
                    ") : " + GenTypeGet(field.value.type) +
                    ".Pack(builder, _o." + camel_name + ");\n";
          } else if (struct_def.fixed && struct_has_create) {
            std::vector<FieldArrayLength> array_lengths;
            FieldArrayLength tmp_array_length = {
              field.name,
              field.value.type.fixed_length,
            };
            array_lengths.push_back(tmp_array_length);
            GenStructPackDecl_ObjectAPI(*field.value.type.struct_def, code_ptr,
                                        array_lengths);
          }
          break;
        }
        case BASE_TYPE_STRING: {
          std::string create_string =
              field.shared ? "CreateSharedString" : "CreateString";
          code += "    var _" + field.name + " = _o." + camel_name +
                  " == null ? default(StringOffset) : "
                  "builder." +
                  create_string + "(_o." + camel_name + ");\n";
          break;
        }
        case BASE_TYPE_VECTOR: {
          if (field_has_create.find(&field) != field_has_create.end()) {
            auto property_name = camel_name;
            auto gen_for_loop = true;
            std::string array_name = "__" + field.name;
            std::string array_type = "";
            std::string to_array = "";
            switch (field.value.type.element) {
              case BASE_TYPE_STRING: {
                std::string create_string =
                    field.shared ? "CreateSharedString" : "CreateString";
                array_type = "StringOffset";
                to_array += "builder." + create_string + "(_o." +
                            property_name + "[_j])";
                break;
              }
              case BASE_TYPE_STRUCT:
                array_type = "Offset<" + GenTypeGet(field.value.type) + ">";
                to_array = GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                           property_name + "[_j])";
                break;
              case BASE_TYPE_UTYPE:
                property_name = camel_name.substr(0, camel_name.size() - 4);
                array_type = NamespacedName(*field.value.type.enum_def);
                to_array = "_o." + property_name + "[_j].Type";
                break;
              case BASE_TYPE_UNION:
                array_type = "int";
                to_array = NamespacedName(*field.value.type.enum_def) +
                           "Union.Pack(builder,  _o." + property_name + "[_j])";
                break;
              default: gen_for_loop = false; break;
            }
            code += "    var _" + field.name + " = default(VectorOffset);\n";
            code += "    if (_o." + property_name + " != null) {\n";
            if (gen_for_loop) {
              code += "      var " + array_name + " = new " + array_type +
                      "[_o." + property_name + ".Count];\n";
              code += "      for (var _j = 0; _j < " + array_name +
                      ".Length; ++_j) { ";
              code += array_name + "[_j] = " + to_array + "; }\n";
            } else {
              code += "      var " + array_name + " = _o." + property_name +
                      ".ToArray();\n";
            }
            code += "      _" + field.name + " = Create" + camel_name_short +
                    "Vector(builder, " + array_name + ");\n";
            code += "    }\n";
          } else {
            auto pack_method =
                field.value.type.struct_def == nullptr
                    ? "builder.Add" + GenMethod(field.value.type.VectorType()) +
                          "(_o." + camel_name + "[_j]);"
                    : GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                          camel_name + "[_j]);";
            code += "    var _" + field.name + " = default(VectorOffset);\n";
            code += "    if (_o." + camel_name + " != null) {\n";
            code += "      Start" + camel_name_short + "Vector(builder, _o." +
                    camel_name + ".Count);\n";
            code += "      for (var _j = _o." + camel_name +
                    ".Count - 1; _j >= 0; --_j) { " + pack_method + " }\n";
            code += "      _" + field.name + " = builder.EndVector();\n";
            code += "    }\n";
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          if (field.value.type.struct_def != nullptr) {
            std::vector<FieldArrayLength> array_lengths;
            FieldArrayLength tmp_array_length = {
              field.name,
              field.value.type.fixed_length,
            };
            array_lengths.push_back(tmp_array_length);
            GenStructPackDecl_ObjectAPI(*field.value.type.struct_def, code_ptr,
                                        array_lengths);
          } else {
            code += "    var _" + field.name + " = _o." + camel_name + ";\n";
          }
          break;
        }
        case BASE_TYPE_UNION: {
          code += "    var _" + field.name + "_type = _o." + camel_name +
                  " == null ? " + NamespacedName(*field.value.type.enum_def) +
                  ".NONE : " + "_o." + camel_name + ".Type;\n";
          code +=
              "    var _" + field.name + " = _o." + camel_name +
              " == null ? 0 : " + GenTypeGet_ObjectAPI(field.value.type, opts) +
              ".Pack(builder, _o." + camel_name + ");\n";
          break;
        }
        default: break;
      }
    }
    if (struct_has_create) {
      // Create
      code += "    return Create" + struct_def.name + "(\n";
      code += "      builder";
      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        auto camel_name = Name(field);
        if (camel_name == struct_def.name) { camel_name += "_"; }
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (struct_def.fixed) {
              GenStructPackCall_ObjectAPI(*field.value.type.struct_def,
                                          code_ptr,
                                          "      _" + field.name + "_");
            } else {
              code += ",\n";
              if (field.value.type.struct_def->fixed) {
                if (opts.generate_object_based_api)
                  code += "      _o." + camel_name;
                else
                  code += "      " + GenTypeGet(field.value.type) +
                          ".Pack(builder, _o." + camel_name + ")";
              } else {
                code += "      _" + field.name;
              }
            }
            break;
          }
          case BASE_TYPE_ARRAY: {
            if (field.value.type.struct_def != nullptr) {
              GenStructPackCall_ObjectAPI(*field.value.type.struct_def,
                                          code_ptr,
                                          "      _" + field.name + "_");
            } else {
              code += ",\n";
              code += "      _" + field.name;
            }
            break;
          }
          case BASE_TYPE_UNION: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_UTYPE: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_STRING: FLATBUFFERS_FALLTHROUGH();  // fall thru
          case BASE_TYPE_VECTOR: {
            code += ",\n";
            code += "      _" + field.name;
            break;
          }
          default:  // scalar
            code += ",\n";
            code += "      _o." + camel_name;
            break;
        }
      }
      code += ");\n";
    } else {
      // Start, End
      code += "    Start" + struct_def.name + "(builder);\n";
      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        auto camel_name = Name(field);
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            if (field.value.type.struct_def->fixed) {
              code += "    Add" + camel_name + "(builder, " +
                      GenTypeGet(field.value.type) + ".Pack(builder, _o." +
                      camel_name + "));\n";
            } else {
              code +=
                  "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            }
            break;
          }
          case BASE_TYPE_STRING: FLATBUFFERS_FALLTHROUGH();  // fall thru
          case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
          case BASE_TYPE_VECTOR: {
            code +=
                "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            break;
          }
          case BASE_TYPE_UTYPE: break;
          case BASE_TYPE_UNION: {
            code += "    Add" + camel_name + "Type(builder, _" + field.name +
                    "_type);\n";
            code +=
                "    Add" + camel_name + "(builder, _" + field.name + ");\n";
            break;
          }
          // scalar
          default: {
            code +=
                "    Add" + camel_name + "(builder, _o." + camel_name + ");\n";
            break;
          }
        }
      }
      code += "    return End" + struct_def.name + "(builder);\n";
    }
    code += "  }\n";
  }